

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexpExtractAll::Bind
          (RegexpExtractAll *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference pvVar1;
  type pEVar2;
  bool constant_pattern;
  Options local_58;
  undefined8 local_40;
  string constant_string;
  
  local_58.max_mem_ = 0x800000;
  local_58.encoding_ = EncodingUTF8;
  local_58.posix_syntax_ = false;
  local_58.longest_match_ = false;
  local_58.log_errors_ = true;
  local_58.literal_ = false;
  local_58.never_nl_ = false;
  local_58.dot_nl_ = false;
  local_58.never_capture_ = false;
  local_58.case_sensitive_ = true;
  local_58.perl_classes_ = false;
  local_58.word_boundary_ = false;
  local_58.one_line_ = false;
  constant_string._M_dataplus._M_p = (pointer)&constant_string.field_2;
  constant_string._M_string_length = 0;
  constant_string.field_2._M_local_buf[0] = '\0';
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar1);
  constant_pattern = regexp_util::TryParseConstantPattern(context,pEVar2,&constant_string);
  if (0x18 < (ulong)((long)(arguments->
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ).
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,3);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar1);
    regexp_util::ParseRegexOptions(context,pEVar2,&local_58,(bool *)0x0);
  }
  make_uniq<duckdb::RegexpExtractBindData,duckdb_re2::RE2::Options&,std::__cxx11::string,bool&,char_const(&)[1]>
            ((duckdb *)&local_40,&local_58,&constant_string,&constant_pattern,
             (char (*) [1])(anon_var_dwarf_3b6586a + 9));
  *(undefined8 *)this = local_40;
  ::std::__cxx11::string::~string((string *)&constant_string);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> RegexpExtractAll::Bind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() >= 2);

	duckdb_re2::RE2::Options options;

	string constant_string;
	bool constant_pattern = TryParseConstantPattern(context, *arguments[1], constant_string);

	if (arguments.size() >= 4) {
		ParseRegexOptions(context, *arguments[3], options);
	}
	return make_uniq<RegexpExtractBindData>(options, std::move(constant_string), constant_pattern, "");
}